

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O3

void __thiscall
psy::C::Parser::parseTrivialSpecifier_AtFirst<psy::C::FunctionSpecifierSyntax>
          (Parser *this,SpecifierSyntax **spec,SyntaxKind specK)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  FunctionSpecifierSyntax *pFVar3;
  IndexType IVar4;
  ostream *poVar5;
  SyntaxKind local_15a;
  SyntaxToken local_158;
  SyntaxToken local_118;
  SyntaxToken local_d8;
  SyntaxToken local_98;
  SyntaxToken local_58;
  
  local_15a = specK;
  pSVar2 = peek(this,1);
  local_58.tree_ = pSVar2->tree_;
  local_58.syntaxK_ = pSVar2->syntaxK_;
  local_58.byteSize_ = pSVar2->byteSize_;
  local_58.charSize_ = pSVar2->charSize_;
  local_58._14_2_ = *(undefined2 *)&pSVar2->field_0xe;
  local_58.byteOffset_ = pSVar2->byteOffset_;
  local_58.charOffset_ = pSVar2->charOffset_;
  local_58.matchingBracket_ = pSVar2->matchingBracket_;
  local_58.field_7 = pSVar2->field_7;
  local_58._34_2_ = *(undefined2 *)&pSVar2->field_0x22;
  local_58.lineno_ = pSVar2->lineno_;
  local_58.column_ = pSVar2->column_;
  local_58._44_4_ = *(undefined4 *)&pSVar2->field_0x2c;
  local_58.field_10 = pSVar2->field_10;
  bVar1 = SyntaxFacts::isStorageClassSyntax(&local_58);
  if (!bVar1) {
    pSVar2 = peek(this,1);
    local_98.field_10 = pSVar2->field_10;
    local_98.tree_ = pSVar2->tree_;
    local_98.syntaxK_ = pSVar2->syntaxK_;
    local_98.byteSize_ = pSVar2->byteSize_;
    local_98.charSize_ = pSVar2->charSize_;
    local_98._14_2_ = *(undefined2 *)&pSVar2->field_0xe;
    local_98.byteOffset_ = pSVar2->byteOffset_;
    local_98.charOffset_ = pSVar2->charOffset_;
    local_98.matchingBracket_ = pSVar2->matchingBracket_;
    local_98.field_7 = pSVar2->field_7;
    local_98._34_2_ = *(undefined2 *)&pSVar2->field_0x22;
    local_98.lineno_ = pSVar2->lineno_;
    local_98.column_ = pSVar2->column_;
    local_98._44_4_ = *(undefined4 *)&pSVar2->field_0x2c;
    bVar1 = SyntaxFacts::isBasicTypeSpecifierSyntax(&local_98);
    if (!bVar1) {
      pSVar2 = peek(this,1);
      local_118.tree_ = pSVar2->tree_;
      local_118.syntaxK_ = pSVar2->syntaxK_;
      local_118.byteSize_ = pSVar2->byteSize_;
      local_118.charSize_ = pSVar2->charSize_;
      local_118._14_2_ = *(undefined2 *)&pSVar2->field_0xe;
      local_118.byteOffset_ = pSVar2->byteOffset_;
      local_118.charOffset_ = pSVar2->charOffset_;
      local_118.matchingBracket_ = pSVar2->matchingBracket_;
      local_118.field_7 = pSVar2->field_7;
      local_118._34_2_ = *(undefined2 *)&pSVar2->field_0x22;
      local_118.lineno_ = pSVar2->lineno_;
      local_118.column_ = pSVar2->column_;
      local_118._44_4_ = *(undefined4 *)&pSVar2->field_0x2c;
      local_118.field_10 = pSVar2->field_10;
      if (((0x3a < local_118.syntaxK_ - 0x32) ||
          ((0x400000000000801U >> ((ulong)(local_118.syntaxK_ - 0x32) & 0x3f) & 1) == 0)) &&
         (local_118.syntaxK_ != KeywordAlias___const)) {
        pSVar2 = peek(this,1);
        local_158.tree_ = pSVar2->tree_;
        local_158.syntaxK_ = pSVar2->syntaxK_;
        local_158.byteSize_ = pSVar2->byteSize_;
        local_158.charSize_ = pSVar2->charSize_;
        local_158._14_2_ = *(undefined2 *)&pSVar2->field_0xe;
        local_158.byteOffset_ = pSVar2->byteOffset_;
        local_158.charOffset_ = pSVar2->charOffset_;
        local_158.matchingBracket_ = pSVar2->matchingBracket_;
        local_158.field_7 = pSVar2->field_7;
        local_158._34_2_ = *(undefined2 *)&pSVar2->field_0x22;
        local_158.lineno_ = pSVar2->lineno_;
        local_158.column_ = pSVar2->column_;
        local_158._44_4_ = *(undefined4 *)&pSVar2->field_0x2c;
        local_158.field_10 = pSVar2->field_10;
        if ((local_158._8_4_ - 0x2e & 0xffbf) != 0) {
          pSVar2 = peek(this,1);
          local_d8.tree_ = pSVar2->tree_;
          local_d8.syntaxK_ = pSVar2->syntaxK_;
          local_d8.byteSize_ = pSVar2->byteSize_;
          local_d8.charSize_ = pSVar2->charSize_;
          local_d8._14_2_ = *(undefined2 *)&pSVar2->field_0xe;
          local_d8.byteOffset_ = pSVar2->byteOffset_;
          local_d8.charOffset_ = pSVar2->charOffset_;
          local_d8.matchingBracket_ = pSVar2->matchingBracket_;
          local_d8.field_7 = pSVar2->field_7;
          local_d8._34_2_ = *(undefined2 *)&pSVar2->field_0x22;
          local_d8.lineno_ = pSVar2->lineno_;
          local_d8.column_ = pSVar2->column_;
          local_d8._44_4_ = *(undefined4 *)&pSVar2->field_0x2c;
          local_d8.field_10 = pSVar2->field_10;
          if ((0x3d < (local_d8._8_8_ & 0xffff)) ||
             ((0x2000500000000000U >> (local_d8._8_8_ & 0x3f) & 1) == 0)) {
            SyntaxToken::~SyntaxToken(&local_d8);
            SyntaxToken::~SyntaxToken(&local_158);
            SyntaxToken::~SyntaxToken(&local_118);
            SyntaxToken::~SyntaxToken(&local_98);
            SyntaxToken::~SyntaxToken(&local_58);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[ASSERT] at ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                       ,100);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x56f);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,
                       "assert failure: <storage-class-specifier>, (builtin) <type-specifier>, <function-specifier>, <type-qualifier>, or<GNU-ext-asm-qualifier>"
                       ,0x88);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            return;
          }
          SyntaxToken::~SyntaxToken(&local_d8);
        }
        SyntaxToken::~SyntaxToken(&local_158);
      }
      SyntaxToken::~SyntaxToken(&local_118);
    }
    SyntaxToken::~SyntaxToken(&local_98);
  }
  SyntaxToken::~SyntaxToken(&local_58);
  pFVar3 = makeNode<psy::C::FunctionSpecifierSyntax,psy::C::SyntaxKind&>(this,&local_15a);
  *spec = (SpecifierSyntax *)pFVar3;
  IVar4 = consume(this);
  (pFVar3->super_TrivialSpecifierSyntax).specTkIdx_ = IVar4;
  return;
}

Assistant:

void Parser::parseTrivialSpecifier_AtFirst(SpecifierSyntax*& spec, SyntaxKind specK)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(SyntaxFacts::isStorageClassSyntax(peek())
                        || SyntaxFacts::isBasicTypeSpecifierSyntax(peek())
                        || SyntaxFacts::isTypeQualifierSyntax(peek())
                        || SyntaxFacts::isFunctionSpecifierSyntax(peek())
                        || SyntaxFacts::isExtGNU_AsmQualifierSyntax(peek()),
                  return,
                  "assert failure: <storage-class-specifier>, "
                                  "(builtin) <type-specifier>, "
                                  "<function-specifier>, "
                                  "<type-qualifier>, or"
                                  "<GNU-ext-asm-qualifier>");

    auto trivSpec = makeNode<SpecT>(specK);
    spec = trivSpec;
    trivSpec->specTkIdx_ = consume();
}